

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_stamp.c
# Opt level: O0

err_t cmdStampVal(char *name,char *stamp_name)

{
  bool_t bVar1;
  size_t *count_00;
  char *name_00;
  size_t count;
  octet *stamp1;
  octet *stamp;
  void *stack;
  octet *in_stack_00000028;
  err_t code;
  size_t in_stack_ffffffffffffffb8;
  char *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffd8;
  size_t *buf;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  err_t local_4;
  
  bVar1 = strIsValid(in_stack_ffffffffffffffc0);
  if ((bVar1 == 0) || (bVar1 = strIsValid(in_stack_ffffffffffffffc0), bVar1 == 0)) {
    local_4 = 0x6d;
  }
  else {
    bVar1 = cmdFileAreSame((char *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                           in_stack_ffffffffffffffd8);
    if (bVar1 == 0) {
      count_00 = (size_t *)blobCreate(in_stack_ffffffffffffffb8);
      local_4 = 0x6e;
      if (count_00 != (size_t *)0x0) {
        local_4 = 0;
      }
      if (local_4 == 0) {
        name_00 = (char *)((long)count_00 + 10);
        buf = count_00;
        local_4 = cmdFileStamp(in_stack_00000028,(char *)stack,stamp._4_4_);
        if (local_4 == 0) {
          local_4 = cmdFileReadAll(buf,count_00,name_00);
          if (local_4 == 0) {
            bVar1 = memEq(count_00,name_00,10);
            if (bVar1 == 0) {
              local_4 = 0xd2;
            }
            blobClose((blob_t)0x10cadf);
          }
          else {
            blobClose((blob_t)0x10caaa);
          }
        }
        else {
          blobClose((blob_t)0x10ca6e);
        }
      }
    }
    else {
      local_4 = cmdFileStamp(in_stack_00000028,(char *)stack,stamp._4_4_);
      if (local_4 == 0xffffffff) {
        local_4 = 0xd2;
      }
    }
  }
  return local_4;
}

Assistant:

err_t cmdStampVal(const char* name, const char* stamp_name)
{
	err_t code;
	// входной контроль
	if (!strIsValid(name) || !strIsValid(stamp_name))
		return ERR_BAD_INPUT;
	// проверить прикрепленный штамп
	if (cmdFileAreSame(name, stamp_name))
	{
		code = cmdFileStamp(0, name, TRUE);
		if (code == ERR_MAX)
			code = ERR_FILE_STAMP;
	}
	// проверить открепленный штамп
	else
	{
		void* stack;
		octet* stamp;
		octet* stamp1;
		size_t count;
		// выделить и разметить память
		code = cmdBlobCreate(stack, 20);
		ERR_CALL_CHECK(code);
		stamp = (octet*)stack;
		stamp1 = stamp + 10;
		// вычислить штамп
		code = cmdFileStamp(stamp, name, FALSE);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// прочитать штамп
		count = 10;
		code = cmdFileReadAll(stamp1, &count, stamp_name);
		ERR_CALL_HANDLE(code, cmdBlobClose(stack));
		// сравнить
		if (!memEq(stamp, stamp1, 10))
			code = ERR_FILE_STAMP;
		cmdBlobClose(stack);
	}
	return code;
}